

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void __thiscall
file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::file_output_t
          (file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this,
          string *filename)

{
  byte bVar1;
  invalid_argument *this_00;
  runtime_error *this_01;
  string *in_RSI;
  output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *in_RDI;
  string err_msg_1;
  string err_msg;
  ifstream f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  allocator local_249;
  string local_248 [32];
  undefined1 local_228 [552];
  
  output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::output_t(in_RDI);
  in_RDI->_vptr_output_t = (_func_int **)&PTR__file_output_t_00216b20;
  std::ofstream::ofstream(in_RDI + 1);
  std::ifstream::ifstream(local_228,in_RSI,_S_in);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"The output file already exists, aborting.",&local_249);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,local_248);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::ofstream::open((string *)(in_RDI + 1),(_Ios_Openmode)in_RSI);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::ifstream::~ifstream(local_228);
    return;
  }
  std::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,(string *)&stack0xfffffffffffffd90);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

file_output_t(const std::string filename) {

		std::ifstream f(filename);
		if (f.good()) {
			std::string err_msg = "The output file already exists, aborting.";
			throw std::invalid_argument(err_msg);
		}

		outstream.open(filename);
		if (outstream.fail()) {
			std::string err_msg = "couldn't open file " + filename;
			throw std::runtime_error(err_msg);
		}
	}